

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::interval_t,duckdb::interval_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  bool bVar1;
  CursorType *dmask_p;
  idx_t iVar2;
  interval_t *piVar3;
  WindowQuantileState<duckdb::interval_t> *in_RCX;
  long in_RDX;
  long in_RSI;
  CursorType *in_R8;
  SubFrames *in_R9;
  interval_t iVar4;
  long in_stack_00000008;
  WindowQuantileState<duckdb::interval_t> *window_state;
  value_type *quantile;
  ValidityMask *rmask;
  interval_t *rdata;
  QuantileBindData *bind_data;
  idx_t n;
  QuantileIncluded<duckdb::interval_t> included;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *gstate;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *state;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffff48;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *this;
  undefined1 in_stack_ffffffffffffff50 [16];
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff60;
  undefined8 local_98;
  int64_t local_90;
  SubFrames *in_stack_ffffffffffffff98;
  QuantileIncluded<duckdb::interval_t> *in_stack_ffffffffffffffa0;
  WindowQuantileState<duckdb::interval_t> *this_00;
  
  this_00 = in_RCX;
  dmask_p = QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50._8_8_);
  QuantileIncluded<duckdb::interval_t>::QuantileIncluded
            ((QuantileIncluded<duckdb::interval_t> *)&stack0xffffffffffffffa0,
             *(ValidityMask **)(in_RSI + 0x58),dmask_p);
  iVar2 = QuantileOperation::FrameSize<duckdb::interval_t>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  optional_ptr<duckdb::FunctionData,_true>::operator->(in_stack_ffffffffffffff50._0_8_);
  FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffff50._0_8_);
  piVar3 = FlatVector::GetData<duckdb::interval_t>((Vector *)0x1d34669);
  FlatVector::Validity((Vector *)0x1d3467b);
  this = in_stack_ffffffffffffff50._0_8_;
  if (iVar2 == 0) {
    TemplatedValidityMask<unsigned_long>::Set
              ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50[7]);
  }
  else {
    vector<duckdb::QuantileValue,_true>::operator[]
              ((vector<duckdb::QuantileValue,_true> *)this,(size_type)in_stack_ffffffffffffff48);
    if ((in_RDX == 0) ||
       (bVar1 = QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::HasTree(this),
       !bVar1)) {
      QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState(this);
      WindowQuantileState<duckdb::interval_t>::UpdateSkip
                (this_00,in_R8,in_R9,(IncludedType *)in_RCX);
      iVar4 = WindowQuantileState<duckdb::interval_t>::WindowScalar<duckdb::interval_t,true>
                        ((WindowQuantileState<duckdb::interval_t> *)included.dmask,
                         (CursorType *)included.fmask,(SubFrames *)n,(idx_t)bind_data,
                         (Vector *)rdata,(QuantileValue *)rmask);
      *(vector<duckdb::FrameBounds,_true> **)(piVar3 + in_stack_00000008) = iVar4._0_8_;
      piVar3[in_stack_00000008].micros = iVar4.micros;
      vector<duckdb::FrameBounds,_true>::operator=(iVar4._0_8_,in_stack_ffffffffffffff48);
    }
    else {
      QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::GetWindowState
                ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)0x1d346da);
      iVar4 = WindowQuantileState<duckdb::interval_t>::WindowScalar<duckdb::interval_t,true>
                        ((WindowQuantileState<duckdb::interval_t> *)included.dmask,
                         (CursorType *)included.fmask,(SubFrames *)n,(idx_t)bind_data,
                         (Vector *)rdata,(QuantileValue *)rmask);
      piVar3 = piVar3 + in_stack_00000008;
      local_98 = iVar4._0_8_;
      piVar3->months = (undefined4)local_98;
      piVar3->days = local_98._4_4_;
      local_90 = iVar4.micros;
      piVar3->micros = local_90;
    }
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}